

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O0

void __thiscall
Catch::anon_unknown_26::ConsoleAssertionPrinter::printReconstructedExpression
          (ConsoleAssertionPrinter *this)

{
  bool bVar1;
  ostream *poVar2;
  Column *col;
  string local_88;
  Column local_68;
  ColourGuard local_20;
  ConsoleAssertionPrinter *local_10;
  ConsoleAssertionPrinter *this_local;
  
  local_10 = this;
  bVar1 = AssertionResult::hasExpandedExpression(this->result);
  if (bVar1) {
    std::operator<<(this->stream,"with expansion:\n");
    poVar2 = this->stream;
    ColourImpl::guardColour((ColourImpl *)&local_20,(Code)this->colourImpl);
    poVar2 = Catch::operator<<(poVar2,&local_20);
    AssertionResult::getExpandedExpression_abi_cxx11_(&local_88,this->result);
    TextFlow::Column::Column(&local_68,&local_88);
    col = TextFlow::Column::indent(&local_68,2);
    poVar2 = TextFlow::operator<<(poVar2,col);
    std::operator<<(poVar2,'\n');
    TextFlow::Column::~Column(&local_68);
    std::__cxx11::string::~string((string *)&local_88);
    ColourImpl::ColourGuard::~ColourGuard(&local_20);
  }
  return;
}

Assistant:

void printReconstructedExpression() const {
        if (result.hasExpandedExpression()) {
            stream << "with expansion:\n";
            stream << colourImpl->guardColour( Colour::ReconstructedExpression )
                   << TextFlow::Column( result.getExpandedExpression() )
                          .indent( 2 )
                   << '\n';
        }
    }